

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBoxPrivate::setupLayout(QMessageBoxPrivate *this)

{
  byte bVar1;
  undefined4 uVar2;
  int fromColumn;
  int fromRow;
  QLayout *pQVar3;
  QWidget *pQVar4;
  void *pvVar5;
  QMessageBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QSpacerItem *indentSpacer;
  bool hasIcon;
  QGridLayout *grid;
  QMessageBox *q;
  AlignmentFlag in_stack_fffffffffffffeac;
  Policy in_stack_fffffffffffffeb0;
  Policy in_stack_fffffffffffffeb4;
  QWidget *in_stack_fffffffffffffeb8;
  SizeConstraint constraint;
  QMessageBoxDetailsText *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed8;
  QMessageBoxPrivate *this_00;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  QWidget *in_stack_fffffffffffffee8;
  QCheckBox *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffefc;
  QGridLayout *in_stack_ffffffffffffff00;
  QWidget *this_01;
  undefined8 in_stack_ffffffffffffff08;
  QFlagsStorage<Qt::AlignmentFlag> QVar6;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  undefined1 local_28 [8];
  QPixmap local_20 [24];
  long local_8;
  
  QVar6.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar3 = QWidget::layout((QWidget *)0x7a333e);
  if (pQVar3 != (QLayout *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  pQVar4 = (QWidget *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  QLabel::pixmap((QLabel *)in_stack_fffffffffffffeb8);
  bVar1 = QPixmap::isNull();
  QPixmap::~QPixmap(local_20);
  bVar1 = (bVar1 ^ 0xff) & 1;
  if (bVar1 != 0) {
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
               (Alignment)in_stack_fffffffffffffefc.i);
  }
  (**(code **)(*(long *)&(in_RDI->iconLabel->super_QFrame).super_QWidget + 0x68))
            (in_RDI->iconLabel,bVar1);
  operator_new(0x28);
  QSpacerItem::QSpacerItem
            ((QSpacerItem *)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
  memset(local_28,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a3513);
  QGridLayout::addItem
            (in_stack_ffffffffffffff00,
             (QLayoutItem *)CONCAT44(in_stack_fffffffffffffefc.i,in_stack_fffffffffffffef8),
             (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8,
             (Alignment)QVar6.i);
  memset(local_2c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a35ad);
  QGridLayout::addWidget
            ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
             (Alignment)in_stack_fffffffffffffefc.i);
  if (in_RDI->informativeLabel != (QLabel *)0x0) {
    QWidget::setContentsMargins
              (&in_stack_fffffffffffffec0->super_QWidget,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    memset(local_30,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a3675);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
               (Alignment)in_stack_fffffffffffffefc.i);
  }
  if (in_RDI->checkbox != (QCheckBox *)0x0) {
    in_stack_fffffffffffffef0 = in_RDI->checkbox;
    uVar2 = 1;
    if (in_RDI->informativeLabel != (QLabel *)0x0) {
      uVar2 = 2;
    }
    in_stack_fffffffffffffefc.i = 1;
    if (bVar1 != 0) {
      in_stack_fffffffffffffefc.i = 2;
    }
    in_stack_fffffffffffffee8 = pQVar4;
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
               (Alignment)in_stack_fffffffffffffefc.i);
    this_01 = pQVar4;
    pvVar5 = operator_new(0x28);
    QVar6.i = (Int)((ulong)pvVar5 >> 0x20);
    QSpacerItem::QSpacerItem
              ((QSpacerItem *)in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    QGridLayout::rowCount
              ((QGridLayout *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    memset(local_38,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a37b1);
    QGridLayout::addItem
              ((QGridLayout *)this_01,(QLayoutItem *)CONCAT44(in_stack_fffffffffffffefc.i,uVar2),
               (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8,
               (Alignment)QVar6.i);
  }
  constraint = (SizeConstraint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  this_00 = (QMessageBoxPrivate *)in_RDI->buttonBox;
  fromColumn = QGridLayout::rowCount
                         ((QGridLayout *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  fromRow = QGridLayout::columnCount
                      ((QGridLayout *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
  ;
  memset(local_3c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a383d);
  QGridLayout::addWidget
            ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,fromRow,fromColumn,
             (int)((ulong)this_00 >> 0x20),(int)this_00,(Alignment)in_stack_fffffffffffffefc.i);
  if (in_RDI->detailsText != (QMessageBoxDetailsText *)0x0) {
    in_stack_fffffffffffffec0 = in_RDI->detailsText;
    QGridLayout::rowCount
              ((QGridLayout *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    constraint = (SizeConstraint)((ulong)pQVar4 >> 0x20);
    QGridLayout::columnCount
              ((QGridLayout *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    memset(local_40,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7a38e1);
    QGridLayout::addWidget
              ((QGridLayout *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,fromRow,fromColumn
               ,(int)((ulong)this_00 >> 0x20),(int)this_00,(Alignment)in_stack_fffffffffffffefc.i);
  }
  QLayout::setSizeConstraint((QLayout *)in_stack_fffffffffffffec0,constraint);
  QWidget::setLayout(in_stack_fffffffffffffee8,(QLayout *)CONCAT44(fromRow,fromColumn));
  retranslateStrings((QMessageBoxPrivate *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  updateSize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::setupLayout()
{
    Q_Q(QMessageBox);
    delete q->layout();
    QGridLayout *grid = new QGridLayout;
    const bool hasIcon = !iconLabel->pixmap().isNull();

    if (hasIcon)
        grid->addWidget(iconLabel, 0, 0, 2, 1, Qt::AlignTop);
    iconLabel->setVisible(hasIcon);
#ifdef Q_OS_MAC
    QSpacerItem *indentSpacer = new QSpacerItem(14, 1, QSizePolicy::Fixed, QSizePolicy::Fixed);
#else
    QSpacerItem *indentSpacer = new QSpacerItem(hasIcon ? 7 : 15, 1, QSizePolicy::Fixed, QSizePolicy::Fixed);
#endif
    grid->addItem(indentSpacer, 0, hasIcon ? 1 : 0, 2, 1);
    grid->addWidget(label, 0, hasIcon ? 2 : 1, 1, 1);
    if (informativeLabel) {
#ifndef Q_OS_MAC
        informativeLabel->setContentsMargins(0, 7, 0, 7);
#endif
        grid->addWidget(informativeLabel, 1, hasIcon ? 2 : 1, 1, 1);
    }
    if (checkbox) {
        grid->addWidget(checkbox, informativeLabel ? 2 : 1, hasIcon ? 2 : 1, 1, 1, Qt::AlignLeft);
#ifdef Q_OS_MAC
        grid->addItem(new QSpacerItem(1, 15, QSizePolicy::Fixed, QSizePolicy::Fixed), grid->rowCount(), 0);
#else
        grid->addItem(new QSpacerItem(1, 7, QSizePolicy::Fixed, QSizePolicy::Fixed), grid->rowCount(), 0);
#endif
    }
#ifdef Q_OS_MAC
    grid->addWidget(buttonBox, grid->rowCount(), hasIcon ? 2 : 1, 1, 1);
    grid->setContentsMargins(0, 0, 0, 0);
    grid->setVerticalSpacing(8);
    grid->setHorizontalSpacing(0);
    q->setContentsMargins(24, 15, 24, 20);
    grid->setRowStretch(1, 100);
    grid->setRowMinimumHeight(2, 6);
#else
    grid->addWidget(buttonBox, grid->rowCount(), 0, 1, grid->columnCount());
#endif
#if QT_CONFIG(textedit)
    if (detailsText)
        grid->addWidget(detailsText, grid->rowCount(), 0, 1, grid->columnCount());
#endif
    grid->setSizeConstraint(QLayout::SetNoConstraint);
    q->setLayout(grid);

    retranslateStrings();
    updateSize();
}